

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_model.c
# Opt level: O3

int fsg_model_add_alt(fsg_model_t *fsg,char *baseword,char *altword)

{
  gnode_s **ppgVar1;
  char **ppcVar2;
  hash_table_t *h;
  undefined8 *puVar3;
  int iVar4;
  int iVar5;
  bitvec_t *pbVar6;
  hash_iter_t *itor;
  undefined8 *ptr;
  glist_t g;
  hash_entry_t *phVar7;
  uint uVar8;
  long lVar9;
  int iVar10;
  gnode_s *pgVar11;
  uint uVar12;
  ulong uVar13;
  
  uVar8 = fsg->n_word;
  if ((long)(int)uVar8 < 1) {
    uVar13 = 0;
LAB_00105080:
    uVar12 = (uint)uVar13;
    if (uVar12 != uVar8) {
      iVar4 = fsg_model_word_add(fsg,altword);
      pbVar6 = fsg->altwords;
      if (pbVar6 == (bitvec_t *)0x0) {
        iVar10 = fsg->n_word_alloc + 0x1f;
        iVar5 = fsg->n_word_alloc + 0x3e;
        if (-1 < iVar10) {
          iVar5 = iVar10;
        }
        pbVar6 = (bitvec_t *)
                 __ckd_calloc__((long)(iVar5 >> 5),4,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                                ,0x1be);
        fsg->altwords = pbVar6;
      }
      uVar8 = 1 << ((byte)iVar4 & 0x1f);
      iVar10 = iVar4 + 0x1f;
      if (-1 < iVar4) {
        iVar10 = iVar4;
      }
      pbVar6[iVar10 >> 5] = pbVar6[iVar10 >> 5] | uVar8;
      pbVar6 = fsg->silwords;
      if ((pbVar6 != (bitvec_t *)0x0) &&
         ((pbVar6[uVar13 >> 5 & 0x7ffffff] >> (uVar12 & 0x1f) & 1) != 0)) {
        pbVar6[iVar10 >> 5] = pbVar6[iVar10 >> 5] | uVar8;
      }
      if (0 < fsg->n_state) {
        lVar9 = 0;
        iVar10 = 0;
        do {
          h = fsg->trans[lVar9].trans;
          if (h != (hash_table_t *)0x0) {
            for (itor = hash_table_iter(h); itor != (hash_iter_t *)0x0;
                itor = hash_table_iter_next(itor)) {
              phVar7 = itor->ent;
              g = (glist_t)phVar7->val;
              pgVar11 = g;
              if (g == (glist_t)0x0) {
                g = (glist_t)0x0;
              }
              else {
                do {
                  puVar3 = (undefined8 *)(pgVar11->data).ptr;
                  if (*(uint *)((long)puVar3 + 0xc) == uVar12) {
                    ptr = (undefined8 *)
                          __listelem_malloc__(fsg->link_alloc,
                                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                                              ,0x1dc);
                    *ptr = *puVar3;
                    *(undefined4 *)(ptr + 1) = *(undefined4 *)(puVar3 + 1);
                    *(int *)((long)ptr + 0xc) = iVar4;
                    g = glist_add_ptr(g,ptr);
                    iVar10 = iVar10 + 1;
                  }
                  ppgVar1 = &pgVar11->next;
                  pgVar11 = *ppgVar1;
                } while (*ppgVar1 != (gnode_s *)0x0);
                phVar7 = itor->ent;
              }
              phVar7->val = g;
            }
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 < fsg->n_state);
        return iVar10;
      }
      return 0;
    }
  }
  else {
    ppcVar2 = fsg->vocab;
    uVar13 = 0;
    do {
      iVar4 = strcmp(ppcVar2[uVar13],baseword);
      if (iVar4 == 0) goto LAB_00105080;
      uVar13 = uVar13 + 1;
    } while ((long)(int)uVar8 != uVar13);
  }
  err_msg(ERR_ERROR,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
          ,0x1b9,"Base word %s not present in FSG vocabulary!\n",baseword);
  return -1;
}

Assistant:

int
fsg_model_add_alt(fsg_model_t * fsg, char const *baseword,
                  char const *altword)
{
    int i, basewid, altwid;
    int ntrans;

    /* FIXME: This will get slow, eventually... */
    for (basewid = 0; basewid < fsg->n_word; ++basewid)
        if (0 == strcmp(fsg->vocab[basewid], baseword))
            break;
    if (basewid == fsg->n_word) {
        E_ERROR("Base word %s not present in FSG vocabulary!\n", baseword);
        return -1;
    }
    altwid = fsg_model_word_add(fsg, altword);
    if (fsg->altwords == NULL)
        fsg->altwords = bitvec_alloc(fsg->n_word_alloc);
    bitvec_set(fsg->altwords, altwid);
    if (fsg_model_is_filler(fsg, basewid)) {
        if (fsg->silwords == NULL)
            fsg->silwords = bitvec_alloc(fsg->n_word_alloc);
        bitvec_set(fsg->silwords, altwid);
    }

    E_DEBUG("Adding alternate word transitions (%s,%s) to FSG\n",
            baseword, altword);

    /* Look for all transitions involving baseword and duplicate them. */
    /* FIXME: This will also get slow, eventually... */
    ntrans = 0;
    for (i = 0; i < fsg->n_state; ++i) {
        hash_iter_t *itor;
        if (fsg->trans[i].trans == NULL)
            continue;
        for (itor = hash_table_iter(fsg->trans[i].trans); itor;
             itor = hash_table_iter_next(itor)) {
            glist_t trans;
            gnode_t *gn;

            trans = hash_entry_val(itor->ent);
            for (gn = trans; gn; gn = gnode_next(gn)) {
                fsg_link_t *fl = gnode_ptr(gn);
                if (fl->wid == basewid) {
                    fsg_link_t *link;

                    /* Create transition object */
                    link = listelem_malloc(fsg->link_alloc);
                    link->from_state = fl->from_state;
                    link->to_state = fl->to_state;
                    link->logs2prob = fl->logs2prob;    /* FIXME!!!??? */
                    link->wid = altwid;

                    trans = glist_add_ptr(trans, (void *) link);
                    ++ntrans;
                }
            }
            hash_entry_val(itor->ent) = trans;
        }
    }

    E_DEBUG("Added %d alternate word transitions\n", ntrans);
    return ntrans;
}